

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupSelf(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  Gia_Obj_t *pGVar19;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pGVar9 = Gia_ManAppendObj(p_00);
  uVar14 = *(ulong *)pGVar9;
  *(ulong *)pGVar9 = uVar14 | 0x9fffffff;
  *(ulong *)pGVar9 =
       uVar14 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar9) && (pGVar9 < pGVar3 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar9) && (pGVar9 < pGVar3 + p_00->nObjs)) {
      pVVar12 = p->vCis;
      if (0 < pVVar12->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001ddd83;
          pGVar19 = p->pObjs;
          if (pGVar19 == (Gia_Obj_t *)0x0) break;
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar14 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar14 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar14 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar11 = p_00->pObjs;
          if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_001ddda2;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * -0x55555555);
          pGVar11 = p_00->pObjs;
          if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_001ddda2;
          pGVar19[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * 0x55555556;
          lVar15 = lVar15 + 1;
          pVVar12 = p->vCis;
        } while (lVar15 < pVVar12->nSize);
      }
      iVar6 = p->nObjs;
      if ((0 < iVar6) && (pGVar19 = p->pObjs, pGVar19 != (Gia_Obj_t *)0x0)) {
        lVar15 = 0;
        do {
          uVar14 = *(ulong *)pGVar19;
          if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            if (((int)pGVar19[-(uVar14 & 0x1fffffff)].Value < 0) ||
               (uVar5 = (uint)(uVar14 >> 0x20), (int)pGVar19[-(ulong)(uVar5 & 0x1fffffff)].Value < 0
               )) goto LAB_001dddc1;
            uVar5 = Gia_ManHashAnd(p_00,pGVar19[-(uVar14 & 0x1fffffff)].Value ^
                                        (uint)(uVar14 >> 0x1d) & 1,
                                   pGVar19[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
            pGVar19->Value = uVar5;
          }
          lVar15 = lVar15 + 1;
          iVar6 = p->nObjs;
        } while ((lVar15 < iVar6) && (pGVar19 = p->pObjs + lVar15, p->pObjs != (Gia_Obj_t *)0x0));
      }
      pVVar12 = p->vCos;
      uVar5 = pVVar12->nSize;
      uVar17 = uVar5 - p->nRegs;
      if (uVar17 != 0 && p->nRegs <= (int)uVar5) {
        uVar16 = 0;
        uVar14 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar14 = uVar16;
        }
        do {
          if (uVar14 == uVar16) goto LAB_001ddde0;
          iVar18 = pVVar12->pArray[uVar16];
          if (((long)iVar18 < 0) || (iVar6 <= iVar18)) goto LAB_001ddd83;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar19 = p->pObjs + iVar18;
          if ((int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value < 0)
          goto LAB_001dddc1;
          pGVar19->Value =
               (uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
               pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value;
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar18 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar5 = (iVar1 - iVar6) + iVar18;
          if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) {
LAB_001ddde0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = p->vCos->pArray[uVar5];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001ddd83;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar19 = p->pObjs + iVar6;
          uVar4 = *(undefined8 *)pGVar19;
          uVar5 = pGVar19[-(ulong)((uint)uVar4 & 0x1fffffff)].Value;
          if ((int)uVar5 < 0) {
LAB_001dddc1:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar11 = Gia_ObjRiToRo(p,pGVar19);
          uVar5 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556,
                                 (uint)uVar4 >> 0x1d & 1 ^ uVar5,pGVar11->Value);
          pGVar19->Value = uVar5;
          iVar18 = iVar18 + 1;
          iVar6 = p->nRegs;
        } while (iVar18 < iVar6);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_001ddd83:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p_00,p->pObjs[iVar6].Value);
          lVar15 = lVar15 + 1;
          pVVar12 = p->vCos;
        } while (lVar15 < pVVar12->nSize);
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
      pGVar13 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar13;
    }
  }
LAB_001ddda2:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupSelf( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, iCtrl;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    iCtrl = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManHashMux( pNew, iCtrl, Gia_ObjFanin0Copy(pObj), Gia_ObjRiToRo(p, pObj)->Value );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}